

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistwidget.cpp
# Opt level: O0

bool __thiscall
QListWidget::dropMimeData(QListWidget *this,int index,QMimeData *data,DropAction action)

{
  byte bVar1;
  DropIndicatorPosition DVar2;
  QAbstractItemModel *pQVar3;
  QListModel *pQVar4;
  int in_ECX;
  DropAction in_EDX;
  int in_ESI;
  QAbstractItemView *in_RDI;
  long in_FS_OFFSET;
  int column;
  int row;
  QModelIndex idx;
  QAbstractItemView *in_stack_ffffffffffffff70;
  uint local_74;
  int local_70;
  undefined1 local_50 [24];
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 *local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = &DAT_aaaaaaaaaaaaaaaa;
  QModelIndex::QModelIndex((QModelIndex *)0x89effc);
  local_74 = 0;
  DVar2 = QAbstractItemView::dropIndicatorPosition(in_stack_ffffffffffffff70);
  local_70 = in_ESI;
  if (DVar2 == OnItem) {
    pQVar3 = QAbstractItemView::model(in_RDI);
    QModelIndex::QModelIndex((QModelIndex *)0x89f044);
    (**(code **)(*(long *)pQVar3 + 0x60))(&local_38,pQVar3,in_ESI,0,local_50);
    local_20 = local_38;
    local_18 = local_30;
    local_10 = local_28;
    local_70 = -1;
    local_74 = 0xffffffff;
  }
  d_func((QListWidget *)0x89f09f);
  pQVar4 = QListWidgetPrivate::listModel((QListWidgetPrivate *)0x89f0a7);
  bVar1 = QAbstractListModel::dropMimeData
                    ((QMimeData *)pQVar4,in_EDX,in_ECX,local_70,(QModelIndex *)(ulong)local_74);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (bool)(bVar1 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QListWidget::dropMimeData(int index, const QMimeData *data, Qt::DropAction action)
{
    QModelIndex idx;
    int row = index;
    int column = 0;
    if (dropIndicatorPosition() == QAbstractItemView::OnItem) {
        // QAbstractListModel::dropMimeData will overwrite on the index if row == -1 and column == -1
        idx = model()->index(row, column);
        row = -1;
        column = -1;
    }
    return d_func()->listModel()->QAbstractListModel::dropMimeData(data, action , row, column, idx);
}